

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void read_all(Lexer *lexer)

{
  uint chr_00;
  int iVar1;
  CharBuff *buff_00;
  Token *data;
  Token *token;
  int chr;
  CharBuff *buff;
  Lexer *lexer_local;
  
  buff_00 = new_buff(10);
  while (chr_00 = read_chr(lexer), chr_00 != 0xc9) {
    iVar1 = is_new_line(chr_00);
    if (iVar1 != 0) {
      lexer->col_pos = 1;
      lexer->row_pos = lexer->row_pos + 1;
    }
    clear_buff(buff_00);
    data = generate_token(lexer,chr_00,buff_00);
    if (data->kind != EMPTY) {
      list_add(lexer->tokens,data);
    }
  }
  recycle_buff(buff_00);
  return;
}

Assistant:

void read_all(Lexer *lexer) {
    CharBuff *buff = new_buff(10);
    int chr;
    Token* token;
    while ((chr = read_chr(lexer)) != END) {
        if (is_new_line(chr)) {
            lexer->col_pos = 1;
            lexer->row_pos++;
        }
        clear_buff(buff);
        if ((token = generate_token(lexer, chr, buff))->kind == EMPTY)continue;
        list_add(lexer->tokens, token);
    }
    recycle_buff(buff);
}